

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void mock_ping2(intptr_t uuid,fio_protocol_s *protocol)

{
  fio_data_s *pfVar1;
  long lVar2;
  
  pfVar1 = fio_data;
  lVar2 = (long)(int)((ulong)uuid >> 8) * 0xa8;
  *(__time_t *)((long)fio_data + lVar2 + 0x60) = (fio_data->last_cycle).tv_sec;
  if (*(char *)((long)pfVar1 + lVar2 + 0x6a) != -1) {
    protocol->ping = mock_ping;
    *(undefined1 *)((long)pfVar1 + lVar2 + 0x6a) = 8;
    fio_close(uuid);
    return;
  }
  return;
}

Assistant:

static void mock_ping2(intptr_t uuid, fio_protocol_s *protocol) {
  (void)protocol;
  touchfd(fio_uuid2fd(uuid));
  if (uuid_data(uuid).timeout == 255)
    return;
  protocol->ping = mock_ping;
  uuid_data(uuid).timeout = 8;
  fio_close(uuid);
}